

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::UTF8CollationIterator::nextCodePoint(UTF8CollationIterator *this,UErrorCode *param_1)

{
  byte bVar1;
  uint uVar2;
  uint8_t *puVar3;
  UChar32 UVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  
  uVar5 = this->pos;
  uVar2 = this->length;
  UVar4 = -1;
  if (uVar5 != uVar2) {
    lVar7 = (long)(int)uVar5;
    puVar3 = this->u8;
    if (((int)uVar2 < 0) && (puVar3[lVar7] == '\0')) {
      this->length = uVar5;
      return UVar4;
    }
    uVar8 = lVar7 + 1;
    this->pos = (uint)uVar8;
    bVar1 = puVar3[lVar7];
    uVar5 = (uint)bVar1;
    if (-1 < (char)bVar1) {
      return uVar5;
    }
    UVar4 = 0xfffd;
    if ((uint)uVar8 != uVar2) {
      if (bVar1 < 0xe0) {
        if (bVar1 < 0xc2) {
          return 0xfffd;
        }
        uVar5 = uVar5 & 0x1f;
      }
      else {
        if (bVar1 < 0xf0) {
          uVar5 = uVar5 & 0xf;
          if (((byte)" 000000000000\x1000"[uVar5] >> (puVar3[uVar8] >> 5) & 1) == 0) {
            return 0xfffd;
          }
          bVar9 = puVar3[uVar8] & 0x3f;
        }
        else {
          if (0xf4 < bVar1) {
            return 0xfffd;
          }
          bVar1 = puVar3[uVar8];
          if (((uint)(int)""[bVar1 >> 4] >> (uVar5 - 0xf0 & 0x1f) & 1) == 0) {
            return 0xfffd;
          }
          uVar8 = lVar7 + 2;
          this->pos = (uint)uVar8;
          if ((uint)uVar8 == uVar2) {
            return 0xfffd;
          }
          bVar9 = puVar3[uVar8] + 0x80;
          if (0x3f < bVar9) {
            return 0xfffd;
          }
          uVar5 = bVar1 & 0x3f | (uVar5 - 0xf0) * 0x40;
          uVar8 = uVar8 & 0xffffffff;
        }
        uVar6 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar6;
        this->pos = uVar6;
        if (uVar6 == uVar2) {
          return 0xfffd;
        }
        uVar5 = (uint)bVar9 | uVar5 << 6;
      }
      bVar1 = puVar3[(int)uVar8];
      if ((byte)(bVar1 ^ 0x80) < 0x40) {
        this->pos = (int)uVar8 + 1;
        return uVar5 << 6 | bVar1 ^ 0x80;
      }
    }
  }
  return UVar4;
}

Assistant:

UChar32
UTF8CollationIterator::nextCodePoint(UErrorCode & /*errorCode*/) {
    if(pos == length) {
        return U_SENTINEL;
    }
    if(u8[pos] == 0 && length < 0) {
        length = pos;
        return U_SENTINEL;
    }
    UChar32 c;
    U8_NEXT_OR_FFFD(u8, pos, length, c);
    return c;
}